

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Res_SimCollectPatterns(Res_Sim_t *p,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  uint *puVar7;
  int local_40;
  int local_3c;
  int j;
  int i;
  uchar *pInfo;
  uchar *pInfoNode;
  uchar *pInfoCare;
  Abc_Obj_t *pObj;
  int fVerbose_local;
  Res_Sim_t *p_local;
  
  pVVar1 = p->vPats;
  pAVar3 = Abc_NtkPo(p->pAig,0);
  pvVar4 = Vec_PtrEntry(pVVar1,pAVar3->Id);
  pVVar1 = p->vPats;
  pAVar3 = Abc_NtkPo(p->pAig,1);
  pvVar5 = Vec_PtrEntry(pVVar1,pAVar3->Id);
  for (local_3c = 0; local_3c < p->nBytesIn; local_3c = local_3c + 1) {
    if (*(char *)((long)pvVar4 + (long)local_3c) != '\0') {
      if ((*(char *)((long)pvVar5 + (long)local_3c) != '\0') &&
         (*(char *)((long)pvVar5 + (long)local_3c) != -1)) {
        __assert_fail("pInfoNode[i] == 0 || pInfoNode[i] == 0xff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                      ,0x27d,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
      }
      if (*(char *)((long)pvVar5 + (long)local_3c) == '\0') {
        if (p->nPats0 < p->nPats) {
          for (local_40 = 0;
              (iVar2 = Abc_NtkPiNum(p->pAig), local_40 < iVar2 &&
              (pAVar3 = Abc_NtkPi(p->pAig,local_40), local_40 != p->nTruePis));
              local_40 = local_40 + 1) {
            pvVar6 = Vec_PtrEntry(p->vPats,pAVar3->Id);
            if ((*(char *)((long)pvVar6 + (long)local_3c) != '\0') &&
               (*(char *)((long)pvVar6 + (long)local_3c) != -1)) {
              __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                            ,0x287,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
            }
            if (*(char *)((long)pvVar6 + (long)local_3c) != '\0') {
              puVar7 = (uint *)Vec_PtrEntry(p->vPats0,local_40);
              Abc_InfoSetBit(puVar7,p->nPats0);
            }
          }
          p->nPats0 = p->nPats0 + 1;
LAB_0059664c:
          if ((p->nPats <= p->nPats0) && (p->nPats <= p->nPats1)) break;
        }
      }
      else if (p->nPats1 < p->nPats) {
        for (local_40 = 0;
            (iVar2 = Abc_NtkPiNum(p->pAig), local_40 < iVar2 &&
            (pAVar3 = Abc_NtkPi(p->pAig,local_40), local_40 != p->nTruePis));
            local_40 = local_40 + 1) {
          pvVar6 = Vec_PtrEntry(p->vPats,pAVar3->Id);
          if ((*(char *)((long)pvVar6 + (long)local_3c) != '\0') &&
             (*(char *)((long)pvVar6 + (long)local_3c) != -1)) {
            __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                          ,0x296,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
          }
          if (*(char *)((long)pvVar6 + (long)local_3c) != '\0') {
            puVar7 = (uint *)Vec_PtrEntry(p->vPats1,local_40);
            Abc_InfoSetBit(puVar7,p->nPats1);
          }
        }
        p->nPats1 = p->nPats1 + 1;
        goto LAB_0059664c;
      }
    }
  }
  if (fVerbose != 0) {
    printf("|  ");
    printf("On = %3d  ",(ulong)(uint)p->nPats1);
    printf("Off = %3d  ",(ulong)(uint)p->nPats0);
    printf("\n");
  }
  return;
}

Assistant:

void Res_SimCollectPatterns( Res_Sim_t * p, int fVerbose )
{
    Abc_Obj_t * pObj;
    unsigned char * pInfoCare, * pInfoNode, * pInfo;
    int i, j;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        // skip don't-care patterns
        if ( !pInfoCare[i] )
            continue;
        // separate offset and onset patterns
        assert( pInfoNode[i] == 0 || pInfoNode[i] == 0xff );
        if ( !pInfoNode[i] )
        {
            if ( p->nPats0 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats0, j), p->nPats0 );
            }
            p->nPats0++;
        }
        else
        {
            if ( p->nPats1 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats1, j), p->nPats1 );
            }
            p->nPats1++;
        }
        if ( p->nPats0 >= p->nPats && p->nPats1 >= p->nPats )
            break;
    }
    if ( fVerbose )
    {
        printf( "|  " );
        printf( "On = %3d  ", p->nPats1 );
        printf( "Off = %3d  ", p->nPats0 );
        printf( "\n" );
    }
}